

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O2

void array_get_bang(t_array_rangeop *x)

{
  _outlet *x_00;
  int iVar1;
  t_atom *argv;
  undefined4 *puVar2;
  long lVar3;
  t_atom *ptVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auStack_38 [12];
  int arrayonset;
  char *firstitem;
  int stride;
  int nitem;
  
  ptVar4 = (t_atom *)auStack_38;
  iVar1 = array_rangeop_getrange
                    (x,(char **)(auStack_38 + 8),(int *)((long)&firstitem + 4),(int *)&firstitem,
                     (int *)(auStack_38 + 4));
  if (iVar1 != 0) {
    lVar6 = (long)(int)firstitem._4_4_;
    if (lVar6 < 100) {
      ptVar4 = (t_atom *)(auStack_38 + lVar6 * -0x10);
      argv = ptVar4;
    }
    else {
      argv = (t_atom *)getbytes(lVar6 << 4);
    }
    lVar3 = 0;
    uVar5 = 0;
    if (0 < (int)firstitem._4_4_) {
      uVar5 = (ulong)firstitem._4_4_;
    }
    puVar2 = stack0xffffffffffffffd0;
    for (; uVar5 * 0x10 != lVar3; lVar3 = lVar3 + 0x10) {
      *(undefined4 *)((long)&argv->a_type + lVar3) = 1;
      *(undefined4 *)((long)&argv->a_w + lVar3) = *puVar2;
      puVar2 = (undefined4 *)((long)puVar2 + (long)(int)firstitem);
    }
    x_00 = (x->x_tc).tc_obj.te_outlet;
    ptVar4[-1].a_w.w_symbol = (t_symbol *)0x1747fd;
    outlet_list(x_00,(t_symbol *)0x0,firstitem._4_4_,argv);
    if (99 < (int)firstitem._4_4_) {
      ptVar4[-1].a_w.w_symbol = (t_symbol *)0x174812;
      freebytes(argv,lVar6 << 4);
    }
  }
  return;
}

Assistant:

static void array_get_bang(t_array_rangeop *x)
{
    char *itemp, *firstitem;
    int stride, nitem, arrayonset, i;
    t_atom *outv;
    if (!array_rangeop_getrange(x, &firstitem, &nitem, &stride, &arrayonset))
        return;
    ATOMS_ALLOCA(outv, nitem);
    for (i = 0, itemp = firstitem; i < nitem; i++, itemp += stride)
        SETFLOAT(&outv[i],  *(t_float *)itemp);
    outlet_list(x->x_outlet, 0, nitem, outv);
    ATOMS_FREEA(outv, nitem);
}